

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O2

void png_write_hIST(png_structrp png_ptr,png_const_uint_16p hist,int num_hist)

{
  undefined8 in_RAX;
  ulong uVar1;
  ulong uVar2;
  undefined5 uStack_38;
  png_byte buf [3];
  
  if ((int)(uint)png_ptr->num_palette < num_hist) {
    png_warning(png_ptr,"Invalid number of histogram entries specified");
    return;
  }
  _uStack_38 = in_RAX;
  png_write_chunk_header(png_ptr,0x68495354,num_hist * 2);
  uVar1 = 0;
  uVar2 = (ulong)(uint)num_hist;
  if (num_hist < 1) {
    uVar2 = uVar1;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    _uStack_38 = CONCAT25(hist[uVar1] << 8 | hist[uVar1] >> 8,uStack_38);
    png_write_chunk_data(png_ptr,buf,2);
  }
  png_write_chunk_end(png_ptr);
  return;
}

Assistant:

void /* PRIVATE */
png_write_hIST(png_structrp png_ptr, png_const_uint_16p hist, int num_hist)
{
   int i;
   png_byte buf[3];

   png_debug(1, "in png_write_hIST");

   if (num_hist > (int)png_ptr->num_palette)
   {
      png_debug2(3, "num_hist = %d, num_palette = %d", num_hist,
          png_ptr->num_palette);

      png_warning(png_ptr, "Invalid number of histogram entries specified");
      return;
   }

   png_write_chunk_header(png_ptr, png_hIST, (png_uint_32)(num_hist * 2));

   for (i = 0; i < num_hist; i++)
   {
      png_save_uint_16(buf, hist[i]);
      png_write_chunk_data(png_ptr, buf, 2);
   }

   png_write_chunk_end(png_ptr);
}